

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

void add_objunit(GlobalVars *gv,ObjectUnit *ou,bool fixrelocs)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  node *pnVar4;
  char *pcVar5;
  node *pnVar6;
  node *pnVar7;
  node *pnVar8;
  list *l;
  node *pnVar9;
  
  if (ou == (ObjectUnit *)0x0) {
    return;
  }
  bVar1 = ou->lnkfile->type;
  if (bVar1 - 1 < 2) {
LAB_00110639:
    *(byte *)&ou->flags = (byte)ou->flags | 1;
    l = &gv->selobjects;
  }
  else if (bVar1 == 4) {
    l = &gv->sharedobjects;
  }
  else {
    if (bVar1 != 8) {
      ierror("add_objunit(): Link File type = %d");
      goto LAB_00110671;
    }
    if (gv->whole_archive != 0) goto LAB_00110639;
    l = &gv->libobjects;
  }
  addtail(l,&ou->n);
LAB_00110671:
  if (fixrelocs != 0) {
    pnVar9 = (ou->sections).first;
    pnVar7 = pnVar9->next;
    while (pnVar7 != (node *)0x0) {
      pnVar6 = pnVar9[6].next;
      pnVar4 = pnVar6->next;
      pnVar8 = pnVar7;
      if (pnVar4 != (node *)0x0) {
        do {
          uVar2 = *(uint *)&pnVar6[1].pred;
          pnVar7 = (ou->sections).first;
          do {
            pnVar8 = pnVar7;
            if (pnVar8->next == (node *)0x0) {
              pnVar6[1].pred = (node *)0x0;
              pcVar3 = ou->lnkfile->pathname;
              pnVar7 = pnVar9[2].next;
              pcVar5 = getobjname(ou);
              error(0x34,pcVar3,pnVar7,pcVar5,(ulong)uVar2);
              pnVar6 = pnVar6->next;
              goto LAB_001106f2;
            }
            pnVar7 = pnVar8->next;
          } while (*(uint *)&pnVar8[2].pred != uVar2);
          pnVar6[1].pred = pnVar8;
          pnVar6 = pnVar4;
LAB_001106f2:
          pnVar4 = pnVar6->next;
        } while (pnVar4 != (node *)0x0);
        pnVar8 = pnVar9->next;
      }
      pnVar9 = pnVar8;
      pnVar7 = pnVar8->next;
    }
  }
  return;
}

Assistant:

void add_objunit(struct GlobalVars *gv,struct ObjectUnit *ou,bool fixrelocs)
/* adds an ObjectUnit to the approriate list */
{
  if (ou) {
    uint8_t t = ou->lnkfile->type;

    if (t==ID_LIBARCH && gv->whole_archive)
      t = ID_OBJECT;  /* force linking of a whole archive */

    switch (t) {
      case ID_OBJECT:
      case ID_EXECUTABLE:
        ou->flags |= OUF_LINKED;  /* objects are always linked */
        addtail(&gv->selobjects,&ou->n);
        break;
      case ID_LIBARCH:
        addtail(&gv->libobjects,&ou->n);
        break;
      case ID_SHAREDOBJ:
        addtail(&gv->sharedobjects,&ou->n);
        break;
      default:
        ierror("add_objunit(): Link File type = %d",
               (int)ou->lnkfile->type);
    }

    if (fixrelocs) {  /* convert section index into address */
      struct Section *sec;
      struct Reloc *r;
      uint32_t idx;

      for (sec=(struct Section *)ou->sections.first;
           sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
        for (r=(struct Reloc *)sec->relocs.first;
             r->n.next!=NULL; r=(struct Reloc *)r->n.next) {
          idx = r->relocsect.id;
          if ((r->relocsect.ptr = find_sect_id(ou,idx)) == NULL) {
            /* section with this index doesn't exist */
            error(52,ou->lnkfile->pathname,sec->name,getobjname(ou),(int)idx);
          }
        }
      }
    }
  }
}